

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_server_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  uint8_t uVar1;
  int local_40;
  int ret;
  uint8_t type;
  ptls_handshake_properties_t *properties_local;
  int is_end_of_record_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  uVar1 = *message.base;
  switch(tls->state) {
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
  case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
    if ((uVar1 == '\x01') && (is_end_of_record != 0)) {
      local_40 = server_handle_hello(tls,emitter,message,properties);
    }
    else {
      local_40 = 0x28;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    if (uVar1 == '\v') {
      local_40 = server_handle_certificate(tls,message);
    }
    else {
      local_40 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (uVar1 == '\x0f') {
      local_40 = server_handle_certificate_verify(tls,message);
    }
    else {
      local_40 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if (((byte)tls->ctx->field_0x70 >> 4 & 1) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0x1189,
                    "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    if (uVar1 == '\x05') {
      local_40 = server_handle_end_of_early_data(tls,message);
    }
    else {
      local_40 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if ((uVar1 == '\x14') && (is_end_of_record != 0)) {
      local_40 = server_handle_finished(tls,message);
    }
    else {
      local_40 = 0x28;
    }
    break;
  default:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0x11a2,
                  "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    if (uVar1 == '\x18') {
      local_40 = handle_key_update(tls,emitter,message);
    }
    else {
      local_40 = 10;
    }
  }
  return local_40;
}

Assistant:

static int handle_server_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}